

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_coin.cpp
# Opt level: O2

int CfdGetEstimateFee(void *handle,void *fee_handle,char *tx_hex,char *fee_asset,bool is_blind,
                     double effective_fee_rate,int64_t *txout_fee,int64_t *utxo_fee)

{
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_> *utxos;
  bool bVar1;
  int64_t iVar2;
  CfdException *pCVar3;
  ConfidentialAssetId *this;
  allocator local_cb;
  allocator local_ca;
  ElementsTransactionApi api;
  ConfidentialAssetId local_c8;
  void *local_a0;
  double local_98;
  TransactionApi api_1;
  Amount utxo_fee_amt;
  Amount tx_fee_amt;
  string local_50;
  
  local_a0 = handle;
  local_98 = effective_fee_rate;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&local_c8,"EstimateFeeData",(allocator *)&api_1);
  cfd::capi::CheckBuffer(fee_handle,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (txout_fee == (int64_t *)0x0) {
    local_c8._vptr_ConfidentialAssetId = (_func_int **)0x523eec;
    local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x31c;
    local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdGetEstimateFee";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_c8,"txout fee is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_c8,"Failed to parameter. txout fee is null.",(allocator *)&api_1);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_c8);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (utxo_fee != (int64_t *)0x0) {
    if (*(char *)((long)fee_handle + 0x10) == '\x01') {
      bVar1 = cfd::capi::IsEmptyString(fee_asset);
      if (bVar1) {
        local_c8._vptr_ConfidentialAssetId = (_func_int **)0x523eec;
        local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x329;
        local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = "CfdGetEstimateFee";
        cfd::core::logger::warn<>((CfdSourceLocation *)&local_c8,"fee asset is empty.");
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_c8,"Failed to parameter. fee asset is empty.",
                   (allocator *)&api_1);
        cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_c8);
        __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
    }
    cfd::core::Amount::Amount(&tx_fee_amt);
    cfd::core::Amount::Amount(&utxo_fee_amt);
    if (*(char *)((long)fee_handle + 0x10) == '\x01') {
      std::__cxx11::string::string((string *)&api_1,tx_hex,&local_ca);
      utxos = *(vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                **)((long)fee_handle + 0x18);
      std::__cxx11::string::string((string *)&local_50,fee_asset,&local_cb);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_c8,&local_50);
      cfd::api::ElementsTransactionApi::EstimateFee
                (&api,(string *)&api_1,utxos,&local_c8,&tx_fee_amt,&utxo_fee_amt,is_blind,local_98,
                 *(int *)((long)fee_handle + 0x28),*(int *)((long)fee_handle + 0x2c),(uint32_t *)0x0
                );
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_c8);
      std::__cxx11::string::~string((string *)&local_50);
      this = (ConfidentialAssetId *)&api_1;
    }
    else {
      std::__cxx11::string::string((string *)&local_c8,tx_hex,(allocator *)&local_50);
      cfd::api::TransactionApi::EstimateFee
                (&api_1,(string *)&local_c8,
                 *(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> **)
                  ((long)fee_handle + 0x20),&tx_fee_amt,&utxo_fee_amt,local_98);
      this = &local_c8;
    }
    std::__cxx11::string::~string((string *)this);
    iVar2 = cfd::core::Amount::GetSatoshiValue(&tx_fee_amt);
    *txout_fee = iVar2;
    iVar2 = cfd::core::Amount::GetSatoshiValue(&utxo_fee_amt);
    *utxo_fee = iVar2;
    return 0;
  }
  local_c8._vptr_ConfidentialAssetId = (_func_int **)0x523eec;
  local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x322;
  local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "CfdGetEstimateFee";
  cfd::core::logger::warn<>((CfdSourceLocation *)&local_c8,"utxo fee is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_c8,"Failed to parameter. utxo fee is null.",(allocator *)&api_1);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_c8);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetEstimateFee(
    void* handle, void* fee_handle, const char* tx_hex, const char* fee_asset,
    bool is_blind, double effective_fee_rate,
    int64_t* txout_fee, int64_t* utxo_fee) {
  try {
    cfd::Initialize();
    CheckBuffer(fee_handle, kPrefixEstimateFeeData);
    CfdCapiEstimateFeeData* buffer =
        static_cast<CfdCapiEstimateFeeData*>(fee_handle);
    if (txout_fee == nullptr) {
      warn(CFD_LOG_SOURCE, "txout fee is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txout fee is null.");
    }
    if (utxo_fee == nullptr) {
      warn(CFD_LOG_SOURCE, "utxo fee is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. utxo fee is null.");
    }
#ifndef CFD_DISABLE_ELEMENTS
    if (buffer->is_elements && IsEmptyString(fee_asset)) {
      warn(CFD_LOG_SOURCE, "fee asset is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fee asset is empty.");
    }
#else
    info(CFD_LOG_SOURCE, "unuse fee asset[{}]", fee_asset);
#endif  // CFD_DISABLE_ELEMENTS

    Amount tx_fee_amt, utxo_fee_amt;
    if (buffer->is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionApi api;
      api.EstimateFee(
          std::string(tx_hex), *(buffer->input_elements_utxos),
          ConfidentialAssetId(fee_asset), &tx_fee_amt, &utxo_fee_amt, is_blind,
          effective_fee_rate, buffer->exponent, buffer->minimum_bits);
#endif  // CFD_DISABLE_ELEMENTS
    } else {
      TransactionApi api;
      api.EstimateFee(
          std::string(tx_hex), *(buffer->input_utxos), &tx_fee_amt,
          &utxo_fee_amt, effective_fee_rate);
    }
    *txout_fee = tx_fee_amt.GetSatoshiValue();
    *utxo_fee = utxo_fee_amt.GetSatoshiValue();

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}